

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deCommandLine.cpp
# Opt level: O1

bool __thiscall
de::cmdline::detail::Parser::parse
          (Parser *this,int numArgs,char **args,CommandLine *dst,ostream *err)

{
  _Rb_tree_header *p_Var1;
  char cVar2;
  byte bVar3;
  ostream *poVar4;
  char **ppcVar5;
  mapped_type *ppOVar6;
  size_t sVar7;
  const_iterator cVar8;
  Entry *pEVar9;
  _Base_ptr p_Var10;
  _Base_ptr p_Var11;
  _Rb_tree_header *p_Var12;
  int iVar13;
  long lVar14;
  byte bVar15;
  undefined4 in_register_00000034;
  char *pcVar16;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_de::cmdline::detail::Parser::OptInfo_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_de::cmdline::detail::Parser::OptInfo_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_de::cmdline::detail::Parser::OptInfo_*>_>_>
  *p_Var17;
  int iVar18;
  int iVar19;
  pointer pOVar20;
  char *pcVar21;
  OptInfo *opt;
  OptSet seenOpts;
  OptMap longOptMap;
  OptMap shortOptMap;
  allocator<char> local_11d;
  undefined4 local_11c;
  key_type local_118;
  CommandLine *local_f8;
  ostream *local_f0;
  undefined8 local_e8;
  char *local_e0;
  char **local_d8;
  int local_cc;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_c8;
  _Rb_tree<const_de::cmdline::detail::Parser::OptInfo_*,_const_de::cmdline::detail::Parser::OptInfo_*,_std::_Identity<const_de::cmdline::detail::Parser::OptInfo_*>,_std::less<const_de::cmdline::detail::Parser::OptInfo_*>,_std::allocator<const_de::cmdline::detail::Parser::OptInfo_*>_>
  local_c0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_de::cmdline::detail::Parser::OptInfo_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_de::cmdline::detail::Parser::OptInfo_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_de::cmdline::detail::Parser::OptInfo_*>_>_>
  local_90;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_de::cmdline::detail::Parser::OptInfo_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_de::cmdline::detail::Parser::OptInfo_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_de::cmdline::detail::Parser::OptInfo_*>_>_>
  local_60;
  
  local_e8 = CONCAT44(in_register_00000034,numArgs);
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_90._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_90._M_impl.super__Rb_tree_header._M_header;
  local_90._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_90._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_90._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_c0._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_c0._M_impl.super__Rb_tree_header._M_header;
  local_c0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_c0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_c0._M_impl.super__Rb_tree_header._M_node_count = 0;
  pOVar20 = (this->m_options).
            super__Vector_base<de::cmdline::detail::Parser::OptInfo,_std::allocator<de::cmdline::detail::Parser::OptInfo>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_f8 = dst;
  local_f0 = err;
  local_d8 = args;
  local_c0._M_impl.super__Rb_tree_header._M_header._M_right =
       local_c0._M_impl.super__Rb_tree_header._M_header._M_left;
  local_90._M_impl.super__Rb_tree_header._M_header._M_right =
       local_90._M_impl.super__Rb_tree_header._M_header._M_left;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  if (pOVar20 !=
      (this->m_options).
      super__Vector_base<de::cmdline::detail::Parser::OptInfo,_std::allocator<de::cmdline::detail::Parser::OptInfo>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    do {
      if (pOVar20->shortName != (char *)0x0) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_118,pOVar20->shortName,&local_11d);
        ppOVar6 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_de::cmdline::detail::Parser::OptInfo_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_de::cmdline::detail::Parser::OptInfo_*>_>_>
                  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_de::cmdline::detail::Parser::OptInfo_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_de::cmdline::detail::Parser::OptInfo_*>_>_>
                                *)&local_60,&local_118);
        *ppOVar6 = pOVar20;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_118._M_dataplus._M_p != &local_118.field_2) {
          operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
        }
      }
      if (pOVar20->longName != (char *)0x0) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_118,pOVar20->longName,&local_11d);
        ppOVar6 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_de::cmdline::detail::Parser::OptInfo_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_de::cmdline::detail::Parser::OptInfo_*>_>_>
                  ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_de::cmdline::detail::Parser::OptInfo_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_de::cmdline::detail::Parser::OptInfo_*>_>_>
                                *)&local_90,&local_118);
        *ppOVar6 = pOVar20;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_118._M_dataplus._M_p != &local_118.field_2) {
          operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
        }
      }
      if (pOVar20->defaultValue == (char *)0x0) {
        if (pOVar20->setDefault != (SetDefaultFunc)0x0) {
          (*pOVar20->setDefault)(&local_f8->m_options);
        }
      }
      else {
        (*pOVar20->dispatchParse)(pOVar20,pOVar20->defaultValue,&local_f8->m_options);
      }
      pOVar20 = pOVar20 + 1;
    } while (pOVar20 !=
             (this->m_options).
             super__Vector_base<de::cmdline::detail::Parser::OptInfo,_std::allocator<de::cmdline::detail::Parser::OptInfo>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  if ((int)local_e8 < 1) {
    bVar15 = 1;
  }
  else {
    local_c8 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               &local_f8->m_args;
    local_cc = (int)local_e8 + -1;
    iVar18 = 0;
    local_11c = (undefined4)CONCAT71((uint7)(uint3)((uint)local_cc >> 8),1);
    do {
      pcVar16 = local_d8[iVar18];
      sVar7 = strlen(pcVar16);
      ppcVar5 = local_d8;
      if (*pcVar16 == '-') {
        if ((pcVar16[1] == '-') && (pcVar16[2] == '\0')) {
          iVar13 = 5;
          if (iVar18 + 1 < (int)local_e8) {
            iVar19 = local_cc - iVar18;
            lVar14 = 0;
            do {
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_118,ppcVar5[(iVar18 + 1) + lVar14],&local_11d);
              std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
              emplace_back<std::__cxx11::string>(local_c8,&local_118);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_118._M_dataplus._M_p != &local_118.field_2) {
                operator_delete(local_118._M_dataplus._M_p,
                                local_118.field_2._M_allocated_capacity + 1);
              }
              lVar14 = lVar14 + 1;
            } while (iVar19 != (int)lVar14);
          }
        }
        else {
          cVar2 = pcVar16[1];
          pcVar21 = pcVar16 + (int)sVar7;
          local_118._M_dataplus._M_p._0_1_ = 0x3d;
          local_e0 = std::__find_if<char_const*,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                               (pcVar16 + (ulong)(cVar2 == '-') + 1,pcVar21,&local_118);
          local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_118,pcVar16 + (ulong)(cVar2 == '-') + 1);
          p_Var17 = &local_60;
          if (cVar2 == '-') {
            p_Var17 = &local_90;
          }
          cVar8 = std::
                  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_de::cmdline::detail::Parser::OptInfo_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_de::cmdline::detail::Parser::OptInfo_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_de::cmdline::detail::Parser::OptInfo_*>_>_>
                  ::find(p_Var17,&local_118);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_118._M_dataplus._M_p != &local_118.field_2) {
            operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
          }
          poVar4 = local_f0;
          p_Var17 = &local_60;
          if (cVar2 == '-') {
            p_Var17 = &local_90;
          }
          if ((_Rb_tree_header *)cVar8._M_node == &(p_Var17->_M_impl).super__Rb_tree_header) {
            local_118._M_dataplus._M_p = (pointer)0x0;
          }
          else {
            local_118._M_dataplus._M_p = *(pointer *)(cVar8._M_node + 2);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_118._M_dataplus._M_p ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0) {
            std::__ostream_insert<char,std::char_traits<char>>
                      (local_f0,"Unrecognized command line option \'",0x22);
            sVar7 = strlen(pcVar16);
            lVar14 = 2;
            std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar16,sVar7);
            pcVar16 = "\'\n";
          }
          else {
            p_Var10 = &local_c0._M_impl.super__Rb_tree_header._M_header;
            for (p_Var11 = local_c0._M_impl.super__Rb_tree_header._M_header._M_parent;
                (_Rb_tree_header *)p_Var11 != (_Rb_tree_header *)0x0;
                p_Var11 = (&p_Var11->_M_left)
                          [*(undefined1 **)(p_Var11 + 1) < local_118._M_dataplus._M_p]) {
              if (*(undefined1 **)(p_Var11 + 1) >= local_118._M_dataplus._M_p) {
                p_Var10 = p_Var11;
              }
            }
            p_Var1 = &local_c0._M_impl.super__Rb_tree_header;
            p_Var12 = p_Var1;
            if (((_Rb_tree_header *)p_Var10 != p_Var1) &&
               (p_Var12 = (_Rb_tree_header *)p_Var10,
               local_118._M_dataplus._M_p <
               (undefined1 *)((_Rb_tree_header *)p_Var10)->_M_node_count)) {
              p_Var12 = p_Var1;
            }
            iVar13 = (int)local_f0;
            if (p_Var12 == p_Var1) {
              std::
              _Rb_tree<de::cmdline::detail::Parser::OptInfo_const*,de::cmdline::detail::Parser::OptInfo_const*,std::_Identity<de::cmdline::detail::Parser::OptInfo_const*>,std::less<de::cmdline::detail::Parser::OptInfo_const*>,std::allocator<de::cmdline::detail::Parser::OptInfo_const*>>
              ::_M_insert_unique<de::cmdline::detail::Parser::OptInfo_const*const&>
                        ((_Rb_tree<de::cmdline::detail::Parser::OptInfo_const*,de::cmdline::detail::Parser::OptInfo_const*,std::_Identity<de::cmdline::detail::Parser::OptInfo_const*>,std::less<de::cmdline::detail::Parser::OptInfo_const*>,std::allocator<de::cmdline::detail::Parser::OptInfo_const*>>
                          *)&local_c0,(OptInfo **)&local_118);
              if (local_118._M_dataplus._M_p[0x20] == '\x01') {
                if (local_e0 == pcVar21) {
                  iVar13 = 0;
                  (**(code **)(local_118._M_dataplus._M_p + 0x48))
                            (local_118._M_dataplus._M_p,0,local_f8);
                }
                else {
                  std::__ostream_insert<char,std::char_traits<char>>
                            (poVar4,"No value expected for command line option \'--",0x2d);
                  pcVar16 = *(char **)(local_118._M_dataplus._M_p + 8);
                  if (pcVar16 == (char *)0x0) {
                    std::ios::clear((int)*(undefined8 *)(*(long *)poVar4 + -0x18) + iVar13);
                  }
                  else {
                    sVar7 = strlen(pcVar16);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar16,sVar7);
                  }
                  iVar13 = 0;
                  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\'\n",2);
                  local_11c = 0;
                }
              }
              else {
                iVar19 = iVar18 + 1;
                if ((iVar19 < (int)local_e8) || (local_e0 != pcVar21)) {
                  if (local_e0 == pcVar21) {
                    pcVar16 = local_d8[iVar19];
                    iVar18 = iVar19;
                  }
                  else {
                    pcVar16 = local_e0 + 1;
                  }
                  iVar13 = 0;
                  (**(code **)(local_118._M_dataplus._M_p + 0x48))
                            (local_118._M_dataplus._M_p,pcVar16,local_f8);
                }
                else {
                  std::__ostream_insert<char,std::char_traits<char>>
                            (poVar4,"Expected value for command line option \'--",0x2a);
                  pcVar16 = *(char **)(local_118._M_dataplus._M_p + 8);
                  if (pcVar16 == (char *)0x0) {
                    std::ios::clear((int)*(undefined8 *)(*(long *)poVar4 + -0x18) + iVar13);
                  }
                  else {
                    sVar7 = strlen(pcVar16);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar16,sVar7);
                  }
                  iVar13 = 0;
                  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\'\n",2);
                  local_11c = 0;
                }
              }
              goto LAB_00134995;
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      (local_f0,"Command line option \'--",0x17);
            pcVar16 = *(char **)(local_118._M_dataplus._M_p + 8);
            if (pcVar16 == (char *)0x0) {
              lVar14 = 0x1b;
              std::ios::clear((int)*(undefined8 *)(*(long *)poVar4 + -0x18) + iVar13);
              pcVar16 = "\' specified multiple times\n";
            }
            else {
              sVar7 = strlen(pcVar16);
              lVar14 = 0x1b;
              std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar16,sVar7);
              pcVar16 = "\' specified multiple times\n";
            }
          }
          std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar16,lVar14);
          iVar13 = 7;
          local_11c = 0;
        }
      }
      else {
        local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
        sVar7 = strlen(pcVar16);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_118,pcVar16,pcVar16 + sVar7);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>(local_c8,&local_118);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_118._M_dataplus._M_p != &local_118.field_2) {
          operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
        }
        iVar13 = 0;
      }
LAB_00134995:
      if ((iVar13 != 7) && (iVar13 != 0)) break;
      iVar18 = iVar18 + 1;
    } while (iVar18 < (int)local_e8);
    bVar15 = (byte)local_11c;
  }
  pEVar9 = TypedFieldMap::get(&local_f8->m_options,
                              (type_info *)&(anonymous_namespace)::Help::typeinfo);
  bVar3 = *pEVar9->value;
  std::
  _Rb_tree<const_de::cmdline::detail::Parser::OptInfo_*,_const_de::cmdline::detail::Parser::OptInfo_*,_std::_Identity<const_de::cmdline::detail::Parser::OptInfo_*>,_std::less<const_de::cmdline::detail::Parser::OptInfo_*>,_std::allocator<const_de::cmdline::detail::Parser::OptInfo_*>_>
  ::~_Rb_tree(&local_c0);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_de::cmdline::detail::Parser::OptInfo_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_de::cmdline::detail::Parser::OptInfo_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_de::cmdline::detail::Parser::OptInfo_*>_>_>
  ::~_Rb_tree(&local_90);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_de::cmdline::detail::Parser::OptInfo_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_de::cmdline::detail::Parser::OptInfo_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_de::cmdline::detail::Parser::OptInfo_*>_>_>
  ::~_Rb_tree(&local_60);
  return (bool)((bVar3 ^ 1) & bVar15);
}

Assistant:

bool Parser::parse (int numArgs, const char* const* args, CommandLine* dst, std::ostream& err) const
{
	typedef map<string, const OptInfo*> OptMap;
	typedef set<const OptInfo*> OptSet;

	OptMap	shortOptMap;
	OptMap	longOptMap;
	OptSet	seenOpts;
	bool	allOk			= true;

	DE_ASSERT(dst->m_args.empty() && dst->m_options.empty());

	for (vector<OptInfo>::const_iterator optIter = m_options.begin(); optIter != m_options.end(); optIter++)
	{
		const OptInfo& opt = *optIter;

		DE_ASSERT(opt.shortName || opt.longName);

		if (opt.shortName)
		{
			DE_ASSERT(shortOptMap.find(opt.shortName) == shortOptMap.end());
			shortOptMap[opt.shortName] = &opt;
		}

		if (opt.longName)
		{
			DE_ASSERT(longOptMap.find(opt.longName) == longOptMap.end());
			longOptMap[opt.longName] = &opt;
		}

		// Set default values.
		if (opt.defaultValue)
			opt.dispatchParse(&opt, opt.defaultValue, &dst->m_options);
		else if (opt.setDefault)
			opt.setDefault(&dst->m_options);
	}

	DE_ASSERT(!dst->m_options.get<Help>());

	for (int argNdx = 0; argNdx < numArgs; argNdx++)
	{
		const char*		arg		= args[argNdx];
		int				argLen	= (int)strlen(arg);

		if (arg[0] == '-' && arg[1] == '-' && arg[2] == 0)
		{
			// End of option list (--)
			for (int optNdx = argNdx+1; optNdx < numArgs; optNdx++)
				dst->m_args.push_back(args[optNdx]);
			break;
		}
		else if (arg[0] == '-')
		{
			const bool				isLongName	= arg[1] == '-';
			const char*				nameStart	= arg + (isLongName ? 2 : 1);
			const char*				nameEnd		= std::find(nameStart, arg+argLen, '=');
			const bool				hasImmValue	= nameEnd != (arg+argLen);
			const OptMap&			optMap		= isLongName ? longOptMap : shortOptMap;
			OptMap::const_iterator	optPos		= optMap.find(string(nameStart, nameEnd));
			const OptInfo*			opt			= optPos != optMap.end() ? optPos->second : DE_NULL;

			if (!opt)
			{
				err << "Unrecognized command line option '" << arg << "'\n";
				allOk = false;
				continue;
			}

			if (seenOpts.find(opt) != seenOpts.end())
			{
				err << "Command line option '--" << opt->longName << "' specified multiple times\n";
				allOk = false;
				continue;
			}

			seenOpts.insert(opt);

			if (opt->isFlag)
			{
				if (!hasImmValue)
				{
					opt->dispatchParse(opt, DE_NULL, &dst->m_options);
				}
				else
				{
					err << "No value expected for command line option '--" << opt->longName << "'\n";
					allOk = false;
				}
			}
			else
			{
				const bool	hasValue	= hasImmValue || (argNdx+1 < numArgs);

				if (hasValue)
				{
					const char*	value	= hasValue ? (hasImmValue ? nameEnd+1 : args[argNdx+1]) : DE_NULL;

					if (!hasImmValue)
						argNdx += 1; // Skip value

					try
					{
						opt->dispatchParse(opt, value, &dst->m_options);
					}
					catch (const std::exception& e)
					{
						err << "Got error parsing command line option '--" << opt->longName << "': " << e.what() << "\n";
						allOk = false;
					}
				}
				else
				{
					err << "Expected value for command line option '--" << opt->longName << "'\n";
					allOk = false;
				}
			}
		}
		else
		{
			// Not an option
			dst->m_args.push_back(arg);
		}
	}

	// Help specified?
	if (dst->m_options.get<Help>())
		allOk = false;

	return allOk;
}